

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O0

void __thiscall
DPusher::DPusher(DPusher *this,EPusher type,line_t *l,int magnitude,int angle,AActor *source,
                int affectee)

{
  double dVar1;
  undefined1 local_50 [40];
  AActor *source_local;
  int angle_local;
  int magnitude_local;
  line_t *l_local;
  DPusher *pDStack_10;
  EPusher type_local;
  DPusher *this_local;
  
  local_50._32_8_ = source;
  source_local._0_4_ = angle;
  source_local._4_4_ = magnitude;
  _angle_local = l;
  l_local._4_4_ = type;
  pDStack_10 = this;
  DThinker::DThinker(&this->super_DThinker,100);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00b6d8c8;
  TObjPtr<AActor>::TObjPtr(&this->m_Source);
  TVector2<double>::TVector2(&this->m_PushVec);
  TObjPtr<AActor>::operator=(&this->m_Source,(AActor *)local_50._32_8_);
  this->m_Type = l_local._4_4_;
  if (_angle_local == (line_t *)0x0) {
    ChangeValues(this,source_local._4_4_,(int)source_local);
  }
  else {
    line_t::Delta((line_t *)local_50);
    TVector2<double>::operator=(&this->m_PushVec,(TVector2<double> *)local_50);
    dVar1 = TVector2<double>::Length(&this->m_PushVec);
    this->m_Magnitude = dVar1;
  }
  if ((AActor *)local_50._32_8_ != (AActor *)0x0) {
    this->m_Radius = this->m_Magnitude * 2.0;
  }
  this->m_Affectee = affectee;
  return;
}

Assistant:

DPusher::DPusher (DPusher::EPusher type, line_t *l, int magnitude, int angle,
				  AActor *source, int affectee)
{
	m_Source = source;
	m_Type = type;
	if (l)
	{
		m_PushVec = l->Delta();
		m_Magnitude = m_PushVec.Length();
	}
	else
	{ // [RH] Allow setting magnitude and angle with parameters
		ChangeValues (magnitude, angle);
	}
	if (source) // point source exist?
	{
		m_Radius = m_Magnitude * 2; // where force goes to zero
	}
	m_Affectee = affectee;
}